

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O2

bool anon_unknown.dwarf_50b73::UpdateSourceProps(ALsource *source,ALCcontext *context)

{
  __int_type_conflict _Var1;
  undefined1 extraout_AL;
  uint uVar2;
  Voice *voice;
  
  _Var1 = (context->mDeferUpdates)._M_base._M_i;
  voice = (Voice *)(ulong)_Var1;
  if (((_Var1 & 1U) == 0) &&
     (uVar2 = source->state & 0xfffffffe, voice = (Voice *)(ulong)uVar2, uVar2 == 0x1012)) {
    voice = GetSourceVoice(source,context);
    if (voice != (Voice *)0x0) {
      UpdateSourceProps(source,voice,context);
      return (bool)extraout_AL;
    }
  }
  (source->PropsClean).super___atomic_flag_base._M_i = false;
  return SUB81(voice,0);
}

Assistant:

bool UpdateSourceProps(ALsource *source, ALCcontext *context)
{
    Voice *voice;
    if(SourceShouldUpdate(source, context) && (voice=GetSourceVoice(source, context)) != nullptr)
        UpdateSourceProps(source, voice, context);
    else
        source->PropsClean.clear(std::memory_order_release);
    return true;
}